

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O2

int obj_trust(int id,X509 *x)

{
  X509_CERT_AUX *pXVar1;
  int iVar2;
  size_t sVar3;
  ASN1_OBJECT *pAVar4;
  size_t i;
  ulong uVar5;
  
  pXVar1 = x->aux;
  if (pXVar1 == (X509_CERT_AUX *)0x0) {
    return 3;
  }
  uVar5 = 0;
  do {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar1->reject);
    if (sVar3 <= uVar5) {
      uVar5 = 0;
      do {
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)pXVar1->trust);
        if (sVar3 <= uVar5) {
          return 3;
        }
        pAVar4 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar1->trust,uVar5);
        iVar2 = OBJ_obj2nid(pAVar4);
        uVar5 = uVar5 + 1;
      } while (iVar2 != id);
      return 1;
    }
    pAVar4 = (ASN1_OBJECT *)OPENSSL_sk_value((OPENSSL_STACK *)pXVar1->reject,uVar5);
    iVar2 = OBJ_obj2nid(pAVar4);
    uVar5 = uVar5 + 1;
  } while (iVar2 != id);
  return 2;
}

Assistant:

static int obj_trust(int id, X509 *x) {
  X509_CERT_AUX *ax = x->aux;
  if (!ax) {
    return X509_TRUST_UNTRUSTED;
  }
  for (size_t i = 0; i < sk_ASN1_OBJECT_num(ax->reject); i++) {
    const ASN1_OBJECT *obj = sk_ASN1_OBJECT_value(ax->reject, i);
    if (OBJ_obj2nid(obj) == id) {
      return X509_TRUST_REJECTED;
    }
  }
  for (size_t i = 0; i < sk_ASN1_OBJECT_num(ax->trust); i++) {
    const ASN1_OBJECT *obj = sk_ASN1_OBJECT_value(ax->trust, i);
    if (OBJ_obj2nid(obj) == id) {
      return X509_TRUST_TRUSTED;
    }
  }
  return X509_TRUST_UNTRUSTED;
}